

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void EmitAssignment(ParseNode *asgnNode,ParseNode *lhs,RegSlot rhsLocation,
                   ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  OpCode OVar1;
  byte bVar2;
  code *pcVar3;
  bool bVar4;
  OpCode OVar5;
  PropertyId propertySlot;
  RegSlot instanceSlot;
  uint uVar6;
  ParseNodeVar *pPVar7;
  ParseNodeBin *pPVar8;
  ParseNodeSuperReference *pPVar9;
  ParseNodeName *pPVar10;
  undefined4 *puVar11;
  IdentPtr pid;
  Symbol *sym;
  bool isConstDecl;
  RegSlot local_34;
  
  OVar1 = lhs->nop;
  if (OVar1 < knopVarDecl) {
    if (OVar1 < knopDot) {
      if (((1 < OVar1 - 0x19) && (OVar1 == knopName)) &&
         (pPVar10 = ParseNode::AsParseNodeName(lhs), pPVar10->isSpecialName != true)) {
        pid = pPVar10->pid;
        sym = pPVar10->sym;
        bVar4 = false;
        isConstDecl = false;
        goto LAB_0080c4f4;
      }
    }
    else {
      if (OVar1 == knopDot) {
        pPVar8 = ParseNode::AsParseNodeBin(lhs);
        pPVar10 = ParseNode::AsParseNodeName(pPVar8->pnode2);
        propertySlot = ParseNodeName::PropertyIdFromNameNode(pPVar10);
        pPVar8 = ParseNode::AsParseNodeBin(lhs);
        bVar4 = ByteCodeGenerator::IsSuper(pPVar8->pnode1);
        if (bVar4) {
          pPVar9 = ParseNode::AsParseNodeSuperReference(lhs);
          Emit((ParseNode *)pPVar9->pnodeThis,byteCodeGenerator,funcInfo,0,false,false);
          pPVar8 = ParseNode::AsParseNodeBin(lhs);
          instanceSlot = ByteCodeGenerator::EmitLdObjProto
                                   (byteCodeGenerator,LdHomeObjProto,pPVar8->pnode1->location,
                                    funcInfo);
          pPVar9 = ParseNode::AsParseNodeSuperReference(lhs);
          FuncInfo::ReleaseLoc(funcInfo,(ParseNode *)pPVar9->pnodeThis);
          uVar6 = FuncInfo::FindOrAddInlineCacheId(funcInfo,instanceSlot,propertySlot,false,true);
          bVar2 = (funcInfo->byteCodeFunction->super_FunctionProxy).field_0x46;
          pPVar9 = ParseNode::AsParseNodeSuperReference(lhs);
          Js::ByteCodeWriter::PatchablePropertyWithThisPtr
                    (&byteCodeGenerator->m_writer,(bVar2 & 1) * 2 + StSuperFld,rhsLocation,
                     instanceSlot,(pPVar9->pnodeThis->super_ParseNodeName).super_ParseNode.location,
                     uVar6,false,true);
        }
        else {
          pPVar8 = ParseNode::AsParseNodeBin(lhs);
          uVar6 = FuncInfo::FindOrAddInlineCacheId
                            (funcInfo,pPVar8->pnode1->location,propertySlot,false,true);
          OVar5 = ByteCodeGenerator::GetStFldOpCode
                            (funcInfo,false,false,false,false,
                             byteCodeGenerator->forceStrictModeForClassComputedPropertyName);
          pPVar8 = ParseNode::AsParseNodeBin(lhs);
          Js::ByteCodeWriter::PatchableProperty
                    (&byteCodeGenerator->m_writer,OVar5,rhsLocation,pPVar8->pnode1->location,uVar6,
                     false,true);
        }
        goto LAB_0080c69b;
      }
      if (OVar1 == knopIndex) {
        pPVar8 = ParseNode::AsParseNodeBin(lhs);
        local_34 = pPVar8->pnode1->location;
        pPVar8 = ParseNode::AsParseNodeBin(lhs);
        bVar4 = ByteCodeGenerator::IsSuper(pPVar8->pnode1);
        if (bVar4) {
          pPVar9 = ParseNode::AsParseNodeSuperReference(lhs);
          Emit((ParseNode *)pPVar9->pnodeThis,byteCodeGenerator,funcInfo,0,false,false);
          pPVar9 = ParseNode::AsParseNodeSuperReference(lhs);
          FuncInfo::ReleaseLoc(funcInfo,(ParseNode *)pPVar9->pnodeThis);
          local_34 = ByteCodeGenerator::EmitLdObjProto
                               (byteCodeGenerator,LdHomeObjProto,local_34,funcInfo);
        }
        OVar5 = ByteCodeGenerator::GetStElemIOpCode(funcInfo);
        pPVar8 = ParseNode::AsParseNodeBin(lhs);
        Js::ByteCodeWriter::Element
                  (&byteCodeGenerator->m_writer,OVar5,rhsLocation,local_34,pPVar8->pnode2->location,
                   false,false);
        goto LAB_0080c69b;
      }
    }
  }
  else {
    if (OVar1 - 0x51 < 3) {
      pPVar7 = ParseNode::AsParseNodeVar(lhs);
      sym = pPVar7->sym;
      if (sym == (Symbol *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x1c31,"(sym != nullptr)","sym != nullptr");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar11 = 0;
        OVar1 = lhs->nop;
        sym = (Symbol *)0x0;
      }
      else {
        OVar1 = lhs->nop;
      }
      isConstDecl = OVar1 == knopConstDecl;
      bVar4 = OVar1 == knopLetDecl;
      pid = (IdentPtr)0x0;
LAB_0080c4f4:
      ByteCodeGenerator::EmitPropStore
                (byteCodeGenerator,rhsLocation,sym,pid,funcInfo,bVar4,isConstDecl,false,false);
      goto LAB_0080c69b;
    }
    if (OVar1 == knopObjectPattern) {
      if (asgnNode != (ParseNode *)0x0) {
        Js::ByteCodeWriter::Reg2(&byteCodeGenerator->m_writer,Ld_A,asgnNode->location,rhsLocation);
      }
      EmitDestructuredObject(lhs,rhsLocation,byteCodeGenerator,funcInfo);
      return;
    }
    if (OVar1 == knopArrayPattern) {
      if (asgnNode != (ParseNode *)0x0) {
        Js::ByteCodeWriter::Reg2(&byteCodeGenerator->m_writer,Ld_A,asgnNode->location,rhsLocation);
      }
      EmitDestructuredArray(lhs,rhsLocation,byteCodeGenerator,funcInfo);
      return;
    }
  }
  Js::ByteCodeWriter::W1(&byteCodeGenerator->m_writer,RuntimeReferenceError,0x1390);
LAB_0080c69b:
  if ((asgnNode != (ParseNode *)0x0) && (asgnNode->location != rhsLocation)) {
    Js::ByteCodeWriter::Reg2(&byteCodeGenerator->m_writer,Ld_A,asgnNode->location,rhsLocation);
    return;
  }
  return;
}

Assistant:

void EmitAssignment(
    ParseNode *asgnNode,
    ParseNode *lhs,
    Js::RegSlot rhsLocation,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo)
{
    switch (lhs->nop)
    {
        // assignment to a local or global variable
    case knopVarDecl:
    case knopLetDecl:
    case knopConstDecl:
    {
        Symbol *sym = lhs->AsParseNodeVar()->sym;
        Assert(sym != nullptr);
        byteCodeGenerator->EmitPropStore(rhsLocation, sym, nullptr, funcInfo, lhs->nop == knopLetDecl, lhs->nop == knopConstDecl);
        break;
    }

    case knopName:
    {
        // Special names like 'this' or 'new.target' cannot be assigned to
        ParseNodeName * pnodeNameLhs = lhs->AsParseNodeName();
        if (pnodeNameLhs->IsSpecialName())
        {
            byteCodeGenerator->Writer()->W1(Js::OpCode::RuntimeReferenceError, SCODE_CODE(JSERR_CantAssignTo));
        }
        else
        {
            byteCodeGenerator->EmitPropStore(rhsLocation, pnodeNameLhs->sym, pnodeNameLhs->pid, funcInfo);
        }
        break;
    }

    // x.y =
    case knopDot:
    {
        // PutValue(x, "y", rhs)
        Js::PropertyId propertyId = lhs->AsParseNodeBin()->pnode2->AsParseNodeName()->PropertyIdFromNameNode();

        if (ByteCodeGenerator::IsSuper(lhs->AsParseNodeBin()->pnode1))
        {
            Emit(lhs->AsParseNodeSuperReference()->pnodeThis, byteCodeGenerator, funcInfo, false);
            Js::RegSlot tmpReg = byteCodeGenerator->EmitLdObjProto(Js::OpCode::LdHomeObjProto, lhs->AsParseNodeBin()->pnode1->location, funcInfo);
            funcInfo->ReleaseLoc(lhs->AsParseNodeSuperReference()->pnodeThis);
            uint cacheId = funcInfo->FindOrAddInlineCacheId(tmpReg, propertyId, false, true);
            Js::OpCode stFldOpCode = funcInfo->GetIsStrictMode() ? Js::OpCode::StSuperFldStrict : Js::OpCode::StSuperFld;
            byteCodeGenerator->Writer()->PatchablePropertyWithThisPtr(stFldOpCode, rhsLocation, tmpReg, lhs->AsParseNodeSuperReference()->pnodeThis->location, cacheId);
        }
        else
        {
            uint cacheId = funcInfo->FindOrAddInlineCacheId(lhs->AsParseNodeBin()->pnode1->location, propertyId, false, true);
            byteCodeGenerator->Writer()->PatchableProperty(
                ByteCodeGenerator::GetStFldOpCode(funcInfo, false, false, false, false, byteCodeGenerator->forceStrictModeForClassComputedPropertyName), rhsLocation, lhs->AsParseNodeBin()->pnode1->location, cacheId);
        }

        break;
    }

    case knopIndex:
    {
        Js::RegSlot targetLocation = lhs->AsParseNodeBin()->pnode1->location;

        if (ByteCodeGenerator::IsSuper(lhs->AsParseNodeBin()->pnode1))
        {
            // We need to emit the 'this' node for the super reference even if we aren't planning to use the 'this' value.
            // This is because we might be in a derived class constructor where we haven't yet called super() to bind the 'this' value.
            // See ecma262 abstract operation 'MakeSuperPropertyReference'
            Emit(lhs->AsParseNodeSuperReference()->pnodeThis, byteCodeGenerator, funcInfo, false);
            funcInfo->ReleaseLoc(lhs->AsParseNodeSuperReference()->pnodeThis);
            targetLocation = byteCodeGenerator->EmitLdObjProto(Js::OpCode::LdHomeObjProto, targetLocation, funcInfo);
        }

        byteCodeGenerator->Writer()->Element(
            ByteCodeGenerator::GetStElemIOpCode(funcInfo),
            rhsLocation, targetLocation, lhs->AsParseNodeBin()->pnode2->location);

        break;
    }

    case knopObjectPattern:
    {
        // Copy the rhs value to be the result of the assignment if needed.
        if (asgnNode != nullptr)
        {
            byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A, asgnNode->location, rhsLocation);
        }
        return EmitDestructuredObject(lhs, rhsLocation, byteCodeGenerator, funcInfo);
    }

    case knopArrayPattern:
    {
        // Copy the rhs value to be the result of the assignment if needed.
        if (asgnNode != nullptr)
        {
            byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A, asgnNode->location, rhsLocation);
        }
        return EmitDestructuredArray(lhs, rhsLocation, byteCodeGenerator, funcInfo);
    }

    case knopArray:
    case knopObject:
        // Assignment to array/object can get through to byte code gen when the parser fails to convert destructuring
        // assignment to pattern (because of structural mismatch between LHS & RHS?). Revisit when we nail
        // down early vs. runtime errors for destructuring.
        byteCodeGenerator->Writer()->W1(Js::OpCode::RuntimeReferenceError, SCODE_CODE(JSERR_CantAssignTo));
        break;

    default:
        byteCodeGenerator->Writer()->W1(Js::OpCode::RuntimeReferenceError, SCODE_CODE(JSERR_CantAssignTo));
        break;
    }

    if (asgnNode != nullptr)
    {
        // We leave it up to the caller to pass this node only if the assignment expression is used.
        if (asgnNode->location != rhsLocation)
        {
            byteCodeGenerator->Writer()->Reg2(Js::OpCode::Ld_A, asgnNode->location, rhsLocation);
        }
    }
}